

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinEncodeUTF8
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  byte bVar1;
  HeapEntity *pHVar2;
  HeapThunk *this_00;
  allocator_type *in_RCX;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *args_2;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  size_type sVar3;
  Value VVar4;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  local_98;
  HeapThunk *th;
  string byteString;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&byteString,"encodeUTF8",(allocator<char> *)&th);
  local_98._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_98._M_impl.super__Vector_impl_data._M_start._4_4_,0x13);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_48,__l,in_RCX);
  params = &local_48;
  args_2 = args;
  validateBuiltinArgs(this,loc,&byteString,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)params);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&byteString);
  encode_utf8(&byteString,
              (UString *)
              ((((args->
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar4 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          *)&local_98);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar4._0_8_;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~_Vector_base(&local_98);
  pHVar2 = (this->scratch).v.h;
  for (sVar3 = 0; byteString._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = byteString._M_dataplus._M_p[sVar3];
    local_98._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_98._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    this_00 = (anonymous_namespace)::Interpreter::
              makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                        ((Interpreter *)this,&this->idArrayElement,(void **)&local_98,(int *)args_2,
                         (void **)params);
    th = this_00;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)(pHVar2 + 1),&th);
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)(double)bVar1;
    local_98._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_98._M_impl.super__Vector_impl_data._M_start._4_4_,2);
    HeapThunk::fill(this_00,(Value *)&local_98);
  }
  std::__cxx11::string::~string((string *)&byteString);
  return (AST *)0x0;
}

Assistant:

const AST *builtinEncodeUTF8(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "encodeUTF8", args, {Value::STRING});

        std::string byteString = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        for (const auto c : byteString) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
            elements.push_back(th);
            th->fill(makeNumber(uint8_t(c)));
        }
        return nullptr;
    }